

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_coroutine_running(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  
  iVar2 = lua_pushthread(L);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  (pTVar1->field_2).it = -iVar2 - 2;
  return 2;
}

Assistant:

LJLIB_CF(coroutine_running)
{
#if LJ_52
  int ismain = lua_pushthread(L);
  setboolV(L->top++, ismain);
  return 2;
#else
  if (lua_pushthread(L))
    setnilV(L->top++);
  return 1;
#endif
}